

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_constructors.hpp
# Opt level: O0

Proxy_Function
chaiscript::dispatch::detail::
build_constructor_<chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>,std::vector<unsigned_short,std::allocator<unsigned_short>>const&>
          (_func_Bidir_Range<const_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,___gnu_cxx::__normal_iterator<const_unsigned_short_ptr,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_vector<unsigned_short,_std::allocator<unsigned_short>_>_ptr
           *param_1)

{
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar1;
  Proxy_Function PVar2;
  anon_class_1_0_00000001_for_m_f call;
  _func_Bidir_Range<const_std::vector<unsigned_short,_std::allocator<unsigned_short>_>,___gnu_cxx::__normal_iterator<const_unsigned_short_ptr,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_vector<unsigned_short,_std::allocator<unsigned_short>_>_ptr
  *param_1_local;
  
  sVar1 = make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&),chaiscript::dispatch::detail::build_constructor_<chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>,std::vector<unsigned_short,std::allocator<unsigned_short>>const&>(chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>(*)(std::vector<unsigned_short,std::allocator<unsigned_short>>const&))::_lambda((auto:1&&)___)_1_>,chaiscript::dispatch::detail::build_constructor_<chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>,std::vector<unsigned_short,std::allocator<unsigned_short>>const&>(chaiscript::bootstrap::standard_library::Bidir_Range<std::vector<unsigned_short,std::allocator<unsigned_short>>const,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>(*)(std::vector<unsigned_short,std::allocator<unsigned_short>>const&))::_lambda((auto:1&&)___)_1_&>
                    ((anon_class_1_0_00000001_for_m_f *)param_1);
  PVar2.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar1.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  PVar2.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)param_1;
  return (Proxy_Function)
         PVar2.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Proxy_Function build_constructor_(Class (*)(Params...)) {
    if constexpr (!std::is_copy_constructible_v<Class>) {
      auto call = [](auto &&...param) { return std::make_shared<Class>(std::forward<decltype(param)>(param)...); };

      return Proxy_Function(
          chaiscript::make_shared<dispatch::Proxy_Function_Base,
                                  dispatch::Proxy_Function_Callable_Impl<std::shared_ptr<Class>(Params...), decltype(call)>>(call));
    } else if constexpr (true) {
      auto call = [](auto &&...param) { return Class(std::forward<decltype(param)>(param)...); };

      return Proxy_Function(
          chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Proxy_Function_Callable_Impl<Class(Params...), decltype(call)>>(
              call));
    }
  }